

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftwareDriver2_helper.h
# Opt level: O0

void irr::memset16(void *dest,u16 value,size_t bytesize)

{
  size_t i;
  u16 *d;
  size_t bytesize_local;
  u16 value_local;
  void *dest_local;
  
  d = (u16 *)dest;
  for (i = bytesize >> 4; i != 0; i = i - 1) {
    *d = value;
    d[1] = value;
    d[2] = value;
    d[3] = value;
    d[4] = value;
    d[5] = value;
    d[6] = value;
    d[7] = value;
    d = d + 8;
  }
  for (i = bytesize >> 1 & 7; i != 0; i = i - 1) {
    *d = value;
    d = d + 1;
  }
  return;
}

Assistant:

inline void memset16(void *dest, const u16 value, size_t bytesize)
{
	u16 *d = (u16 *)dest;

	size_t i;

	// loops unrolled to reduce the number of increments by factor ~8.
	i = bytesize >> (1 + 3);
	while (i) {
		d[0] = value;
		d[1] = value;
		d[2] = value;
		d[3] = value;

		d[4] = value;
		d[5] = value;
		d[6] = value;
		d[7] = value;

		d += 8;
		--i;
	}

	i = (bytesize >> 1) & 7;
	while (i) {
		d[0] = value;
		++d;
		--i;
	}
}